

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O2

exr_result_t
outputBits(int nBits,uint64_t bits,uint64_t *c,int *lc,uint8_t **outptr,uint8_t *outend)

{
  uint64_t uVar1;
  ulong uVar2;
  int iVar3;
  uint8_t *puVar4;
  
  uVar1 = *c;
  puVar4 = *outptr;
  iVar3 = nBits + *lc;
  *lc = iVar3;
  *c = uVar1 << ((byte)nBits & 0x3f) | bits;
  while( true ) {
    if (iVar3 < 8) {
      *outptr = puVar4;
      return 0;
    }
    if (outend <= puVar4) break;
    uVar2 = *c;
    *lc = iVar3 + -8;
    *puVar4 = (uint8_t)(uVar2 >> ((byte)(iVar3 + -8) & 0x3f));
    puVar4 = puVar4 + 1;
    iVar3 = *lc;
  }
  return 4;
}

Assistant:

static inline exr_result_t
outputBits (int nBits, uint64_t bits, uint64_t* c, int* lc, uint8_t** outptr, uint8_t *outend)
{
    uint8_t* out = *outptr;
    *c <<= nBits;
    *lc += nBits;
    *c |= bits;

    while (*lc >= 8)
    {
        if (out >= outend) return EXR_ERR_ARGUMENT_OUT_OF_RANGE;
        *out++ = (uint8_t) (*c >> (*lc -= 8));
    }
    *outptr = out;
    return EXR_ERR_SUCCESS;
}